

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall Session::Session(Session *this)

{
  Session *this_local;
  
  this->_vptr_Session = (_func_int **)&PTR__Session_00223cf8;
  this->slot = (Slot *)0x0;
  this->token = (Token *)0x0;
  this->isReadWrite = false;
  this->hSession = 0;
  this->pApplication = (CK_VOID_PTR)0x0;
  this->notify = (CK_NOTIFY)0x0;
  this->operation = 0;
  this->findOp = (FindOperation *)0x0;
  this->digestOp = (HashAlgorithm *)0x0;
  this->hashAlgo = Unknown;
  this->macOp = (MacAlgorithm *)0x0;
  this->asymmetricCryptoOp = (AsymmetricAlgorithm *)0x0;
  this->symmetricCryptoOp = (SymmetricAlgorithm *)0x0;
  this->mechanism = Unknown;
  this->reAuthentication = false;
  this->allowSinglePartOp = false;
  this->allowMultiPartOp = false;
  this->publicKey = (PublicKey *)0x0;
  this->privateKey = (PrivateKey *)0x0;
  this->symmetricKey = (SymmetricKey *)0x0;
  this->param = (void *)0x0;
  this->paramLen = 0;
  return;
}

Assistant:

Session::Session()
{
	slot = NULL;
	token = NULL;
	isReadWrite = false;
	hSession = CK_INVALID_HANDLE;
	pApplication = NULL;
	notify = NULL;
	operation = SESSION_OP_NONE;
	findOp = NULL;
	digestOp = NULL;
	hashAlgo = HashAlgo::Unknown;
	macOp = NULL;
	asymmetricCryptoOp = NULL;
	symmetricCryptoOp = NULL;
	mechanism = AsymMech::Unknown;
	reAuthentication = false;
	allowSinglePartOp = false;
	allowMultiPartOp = false;
	publicKey = NULL;
	privateKey = NULL;
	symmetricKey = NULL;
	param = NULL;
	paramLen = 0;
}